

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_inverse_fast_fourier_transform.cc
# Opt level: O3

bool __thiscall
sptk::RealValuedInverseFastFourierTransform::Run
          (RealValuedInverseFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  long lVar1;
  int iVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  bVar4 = RealValuedFastFourierTransform::Run
                    (&this->fast_fourier_transform_,real_part_input,real_part_output,
                     imag_part_output,&buffer->fast_fourier_transform_buffer_);
  if (bVar4) {
    iVar2 = (this->fast_fourier_transform_).fft_length_;
    bVar4 = true;
    if ((long)iVar2 != 0) {
      pdVar3 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar1 = (long)iVar2 * 8;
      lVar5 = 0;
      do {
        *(double *)((long)pdVar3 + lVar5) =
             *(double *)((long)pdVar3 + lVar5) * (1.0 / (double)iVar2);
        lVar5 = lVar5 + 8;
      } while (lVar1 - lVar5 != 0);
      if (iVar2 != 0) {
        pdVar3 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = 0;
        do {
          *(double *)((long)pdVar3 + lVar5) =
               *(double *)((long)pdVar3 + lVar5) * (1.0 / (double)iVar2);
          lVar5 = lVar5 + 8;
        } while (lVar1 - lVar5 != 0);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool RealValuedInverseFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedInverseFastFourierTransform::Buffer* buffer) const {
  if (NULL == buffer) {
    return false;
  }

  if (!fast_fourier_transform_.Run(real_part_input, real_part_output,
                                   imag_part_output,
                                   &buffer->fast_fourier_transform_buffer_)) {
    return false;
  }

  const int fft_length(fast_fourier_transform_.GetFftLength());
  const double z(1.0 / fft_length);
  std::transform(real_part_output->begin(),
                 real_part_output->begin() + fft_length,
                 real_part_output->begin(), [z](double x) { return x * z; });
  std::transform(imag_part_output->begin(),
                 imag_part_output->begin() + fft_length,
                 imag_part_output->begin(), [z](double x) { return x * z; });

  return true;
}